

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_end_stream(Parser *this)

{
  uint uVar1;
  State *pSVar2;
  char *pcVar3;
  char *pcVar4;
  Tree *pTVar5;
  ulong uVar6;
  code *pcVar7;
  size_t sVar8;
  Location LVar9;
  undefined1 auVar10 [24];
  Location LVar11;
  Location LVar12;
  Location LVar13;
  bool bVar14;
  NodeType NVar15;
  NodeData *n;
  size_t node;
  csubstr cVar16;
  csubstr tag;
  csubstr fmt;
  csubstr val;
  csubstr anchor;
  char msg [34];
  char local_e8 [24];
  char *pcStack_d0;
  undefined8 local_c8;
  undefined3 uStack_c0;
  undefined5 uStack_bd;
  undefined3 uStack_b8;
  char acStack_b5 [21];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  if ((this->m_stack).m_size == 0) {
    builtin_strncpy(local_e8 + 0x10," m_stack",8);
    pcStack_d0 = (char *)0x29287974706d652e;
    builtin_strncpy(local_e8,"check failed: (!",0x10);
    local_c8._0_2_ = 0x29;
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    local_50 = 0;
    uStack_48 = 0x778f;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    auVar10 = ZEXT1224(ZEXT412(0x778f) << 0x40);
    LVar9.name.str._0_4_ = 0x1fdf9a;
    LVar9.super_LineCol.offset = auVar10._0_8_;
    LVar9.super_LineCol.line = auVar10._8_8_;
    LVar9.super_LineCol.col = auVar10._16_8_;
    LVar9.name.str._4_4_ = 0;
    LVar9.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_e8,0x22,LVar9,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar2 = this->m_state;
  if (((uint)pSVar2->flags >> 9 & 1) == 0) {
    if ((pSVar2->flags & 0x98U) != 0x88) {
      n = (NodeData *)0x0;
      if (((this->m_val_tag).len != 0) && ((this->m_val_tag).str != (char *)0x0)) {
        pTVar5 = this->m_tree;
        uVar6 = pSVar2->node_id;
        if ((uVar6 == 0xffffffffffffffff) || (pTVar5->m_cap <= uVar6)) {
          if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
            pcVar7 = (code *)swi(3);
            (*pcVar7)();
            return;
          }
          local_e8[0] = '\0';
          local_e8[1] = '\0';
          local_e8[2] = '\0';
          local_e8[3] = '\0';
          local_e8[4] = '\0';
          local_e8[5] = '\0';
          local_e8[6] = '\0';
          local_e8[7] = '\0';
          local_e8[8] = -0x7a;
          local_e8[9] = 'K';
          local_e8[10] = '\0';
          local_e8[0xb] = '\0';
          local_e8[0xc] = '\0';
          local_e8[0xd] = '\0';
          local_e8[0xe] = '\0';
          local_e8[0xf] = '\0';
          local_e8[0x10] = '\0';
          local_e8[0x11] = '\0';
          local_e8[0x12] = '\0';
          local_e8[0x13] = '\0';
          local_e8[0x14] = '\0';
          local_e8[0x15] = '\0';
          local_e8[0x16] = '\0';
          local_e8[0x17] = '\0';
          pcStack_d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_c8._0_1_ = 'e';
          local_c8._1_1_ = '\0';
          local_c8._2_1_ = '\0';
          local_c8._3_1_ = '\0';
          local_c8._4_1_ = '\0';
          local_c8._5_1_ = '\0';
          local_c8._6_1_ = '\0';
          local_c8._7_1_ = '\0';
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if (((pTVar5->m_buf[uVar6].m_type.type & DOC) == NOTYPE) &&
           (NVar15 = Tree::type(this->m_tree,this->m_state->node_id), NVar15.type != NOTYPE))
        goto LAB_001d01f7;
        n = (NodeData *)0x0;
        val.len = 0;
        val.str = (this->m_state->line_contents).rem.str;
        Tree::to_val(this->m_tree,this->m_state->node_id,val,0x10);
        uVar6 = this->m_state->node_id;
        if (uVar6 != 0xffffffffffffffff) {
          pTVar5 = this->m_tree;
          if (pTVar5->m_cap <= uVar6) {
            if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar7 = (code *)swi(3);
              (*pcVar7)();
              return;
            }
            local_e8[0] = '\0';
            local_e8[1] = '\0';
            local_e8[2] = '\0';
            local_e8[3] = '\0';
            local_e8[4] = '\0';
            local_e8[5] = '\0';
            local_e8[6] = '\0';
            local_e8[7] = '\0';
            local_e8[8] = 't';
            local_e8[9] = 'K';
            local_e8[10] = '\0';
            local_e8[0xb] = '\0';
            local_e8[0xc] = '\0';
            local_e8[0xd] = '\0';
            local_e8[0xe] = '\0';
            local_e8[0xf] = '\0';
            local_e8[0x10] = '\0';
            local_e8[0x11] = '\0';
            local_e8[0x12] = '\0';
            local_e8[0x13] = '\0';
            local_e8[0x14] = '\0';
            local_e8[0x15] = '\0';
            local_e8[0x16] = '\0';
            local_e8[0x17] = '\0';
            pcStack_d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_c8._0_1_ = 'e';
            local_c8._1_1_ = '\0';
            local_c8._2_1_ = '\0';
            local_c8._3_1_ = '\0';
            local_c8._4_1_ = '\0';
            local_c8._5_1_ = '\0';
            local_c8._6_1_ = '\0';
            local_c8._7_1_ = '\0';
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: i >= 0 && i < m_cap",0x21,
                       (anonymous_namespace)::s_default_callbacks);
          }
          n = pTVar5->m_buf + uVar6;
        }
      }
      goto LAB_001cfcbc;
    }
    pcVar3 = (pSVar2->line_contents).rem.str;
    pcVar4 = (this->m_buf).str;
    if ((pcVar3 < pcVar4) || (pcVar4 + (this->m_buf).len < pcVar3)) {
      uStack_b8 = 0x667562;
      builtin_strncpy(acStack_b5,".end())",8);
      local_c8._0_1_ = 'n';
      local_c8._1_1_ = '(';
      local_c8._2_1_ = ')';
      local_c8._3_1_ = ' ';
      local_c8._4_1_ = '&';
      local_c8._5_1_ = '&';
      local_c8._6_1_ = ' ';
      local_c8._7_1_ = 's';
      uStack_c0 = 0x207274;
      uStack_bd = 0x5f6d203d3c;
      builtin_strncpy(local_e8 + 0x10,"tr >= m_",8);
      pcStack_d0 = (char *)0x696765622e667562;
      builtin_strncpy(local_e8,"check failed: (s",0x10);
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      local_a0 = 0;
      uStack_98 = 0x5e95;
      local_90 = 0;
      pcStack_88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_80 = 0x65;
      auVar10 = ZEXT1224(ZEXT412(0x5e95) << 0x40);
      LVar11.name.str._0_4_ = 0x1fdf9a;
      LVar11.super_LineCol.offset = auVar10._0_8_;
      LVar11.super_LineCol.line = auVar10._8_8_;
      LVar11.super_LineCol.col = auVar10._16_8_;
      LVar11.name.str._4_4_ = 0;
      LVar11.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_e8,0x3b,LVar11,(this->m_stack).m_callbacks.m_user_data);
    }
    cVar16 = (csubstr)ZEXT816(0);
LAB_001cfcb2:
    n = _append_val(this,cVar16,0);
  }
  else {
    pTVar5 = this->m_tree;
    uVar6 = pSVar2->node_id;
    if ((uVar6 == 0xffffffffffffffff) || (pTVar5->m_cap <= uVar6)) {
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      local_e8[0] = '\0';
      local_e8[1] = '\0';
      local_e8[2] = '\0';
      local_e8[3] = '\0';
      local_e8[4] = '\0';
      local_e8[5] = '\0';
      local_e8[6] = '\0';
      local_e8[7] = '\0';
      local_e8[8] = -0x7a;
      local_e8[9] = 'K';
      local_e8[10] = '\0';
      local_e8[0xb] = '\0';
      local_e8[0xc] = '\0';
      local_e8[0xd] = '\0';
      local_e8[0xe] = '\0';
      local_e8[0xf] = '\0';
      local_e8[0x10] = '\0';
      local_e8[0x11] = '\0';
      local_e8[0x12] = '\0';
      local_e8[0x13] = '\0';
      local_e8[0x14] = '\0';
      local_e8[0x15] = '\0';
      local_e8[0x16] = '\0';
      local_e8[0x17] = '\0';
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8._0_1_ = 'e';
      local_c8._1_1_ = '\0';
      local_c8._2_1_ = '\0';
      local_c8._3_1_ = '\0';
      local_c8._4_1_ = '\0';
      local_c8._5_1_ = '\0';
      local_c8._6_1_ = '\0';
      local_c8._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar5->m_buf[uVar6].m_type.type & SEQ) != NOTYPE) {
      cVar16 = _consume_scalar(this);
      goto LAB_001cfcb2;
    }
    pTVar5 = this->m_tree;
    uVar6 = this->m_state->node_id;
    if ((uVar6 == 0xffffffffffffffff) || (pTVar5->m_cap <= uVar6)) {
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      local_e8[0] = '\0';
      local_e8[1] = '\0';
      local_e8[2] = '\0';
      local_e8[3] = '\0';
      local_e8[4] = '\0';
      local_e8[5] = '\0';
      local_e8[6] = '\0';
      local_e8[7] = '\0';
      local_e8[8] = -0x7a;
      local_e8[9] = 'K';
      local_e8[10] = '\0';
      local_e8[0xb] = '\0';
      local_e8[0xc] = '\0';
      local_e8[0xd] = '\0';
      local_e8[0xe] = '\0';
      local_e8[0xf] = '\0';
      local_e8[0x10] = '\0';
      local_e8[0x11] = '\0';
      local_e8[0x12] = '\0';
      local_e8[0x13] = '\0';
      local_e8[0x14] = '\0';
      local_e8[0x15] = '\0';
      local_e8[0x16] = '\0';
      local_e8[0x17] = '\0';
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8._0_1_ = 'e';
      local_c8._1_1_ = '\0';
      local_c8._2_1_ = '\0';
      local_c8._3_1_ = '\0';
      local_c8._4_1_ = '\0';
      local_c8._5_1_ = '\0';
      local_c8._6_1_ = '\0';
      local_c8._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar5->m_buf[uVar6].m_type.type & MAP) == NOTYPE) {
      pTVar5 = this->m_tree;
      uVar6 = this->m_state->node_id;
      if ((uVar6 == 0xffffffffffffffff) || (pTVar5->m_cap <= uVar6)) {
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        local_e8[0] = '\0';
        local_e8[1] = '\0';
        local_e8[2] = '\0';
        local_e8[3] = '\0';
        local_e8[4] = '\0';
        local_e8[5] = '\0';
        local_e8[6] = '\0';
        local_e8[7] = '\0';
        local_e8[8] = -0x7a;
        local_e8[9] = 'K';
        local_e8[10] = '\0';
        local_e8[0xb] = '\0';
        local_e8[0xc] = '\0';
        local_e8[0xd] = '\0';
        local_e8[0xe] = '\0';
        local_e8[0xf] = '\0';
        local_e8[0x10] = '\0';
        local_e8[0x11] = '\0';
        local_e8[0x12] = '\0';
        local_e8[0x13] = '\0';
        local_e8[0x14] = '\0';
        local_e8[0x15] = '\0';
        local_e8[0x16] = '\0';
        local_e8[0x17] = '\0';
        pcStack_d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_c8._0_1_ = 'e';
        local_c8._1_1_ = '\0';
        local_c8._2_1_ = '\0';
        local_c8._3_1_ = '\0';
        local_c8._4_1_ = '\0';
        local_c8._5_1_ = '\0';
        local_c8._6_1_ = '\0';
        local_c8._7_1_ = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (((pTVar5->m_buf[uVar6].m_type.type & DOC) == NOTYPE) &&
         (NVar15 = Tree::type(this->m_tree,this->m_state->node_id), NVar15.type != NOTYPE)) {
        bVar14 = is_debugger_attached();
        if ((bVar14) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        cVar16.len = 0x15;
        cVar16.str = "ERROR: internal error";
        _err<>(this,cVar16);
      }
      else {
        uVar1 = this->m_state->flags;
        cVar16 = _consume_scalar(this);
        Tree::to_val(this->m_tree,this->m_state->node_id,cVar16,(ulong)(uVar1 & 0x400) * 4 + 0x10);
        uVar6 = this->m_state->node_id;
        if (uVar6 != 0xffffffffffffffff) {
          pTVar5 = this->m_tree;
          if (pTVar5->m_cap <= uVar6) {
            if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
              pcVar7 = (code *)swi(3);
              (*pcVar7)();
              return;
            }
            local_e8[0] = '\0';
            local_e8[1] = '\0';
            local_e8[2] = '\0';
            local_e8[3] = '\0';
            local_e8[4] = '\0';
            local_e8[5] = '\0';
            local_e8[6] = '\0';
            local_e8[7] = '\0';
            local_e8[8] = 't';
            local_e8[9] = 'K';
            local_e8[10] = '\0';
            local_e8[0xb] = '\0';
            local_e8[0xc] = '\0';
            local_e8[0xd] = '\0';
            local_e8[0xe] = '\0';
            local_e8[0xf] = '\0';
            local_e8[0x10] = '\0';
            local_e8[0x11] = '\0';
            local_e8[0x12] = '\0';
            local_e8[0x13] = '\0';
            local_e8[0x14] = '\0';
            local_e8[0x15] = '\0';
            local_e8[0x16] = '\0';
            local_e8[0x17] = '\0';
            pcStack_d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_c8._0_1_ = 'e';
            local_c8._1_1_ = '\0';
            local_c8._2_1_ = '\0';
            local_c8._3_1_ = '\0';
            local_c8._4_1_ = '\0';
            local_c8._5_1_ = '\0';
            local_c8._6_1_ = '\0';
            local_c8._7_1_ = '\0';
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: i >= 0 && i < m_cap",0x21,
                       (anonymous_namespace)::s_default_callbacks);
          }
          n = pTVar5->m_buf + uVar6;
          goto LAB_001cfcbc;
        }
      }
LAB_001d01f7:
      n = (NodeData *)0x0;
    }
    else {
      pcVar3 = (this->m_state->line_contents).rem.str;
      pcVar4 = (this->m_buf).str;
      if ((pcVar3 < pcVar4) || (pcVar4 + (this->m_buf).len < pcVar3)) {
        uStack_b8 = 0x667562;
        builtin_strncpy(acStack_b5,".end())",8);
        local_c8._0_1_ = 'n';
        local_c8._1_1_ = '(';
        local_c8._2_1_ = ')';
        local_c8._3_1_ = ' ';
        local_c8._4_1_ = '&';
        local_c8._5_1_ = '&';
        local_c8._6_1_ = ' ';
        local_c8._7_1_ = 's';
        uStack_c0 = 0x207274;
        uStack_bd = 0x5f6d203d3c;
        builtin_strncpy(local_e8 + 0x10,"tr >= m_",8);
        pcStack_d0 = (char *)0x696765622e667562;
        builtin_strncpy(local_e8,"check failed: (s",0x10);
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        local_a0 = 0;
        uStack_98 = 0x5e96;
        local_90 = 0;
        pcStack_88 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_80 = 0x65;
        auVar10 = ZEXT1224(ZEXT412(0x5e96) << 0x40);
        LVar13.name.str._0_4_ = 0x1fdf9a;
        LVar13.super_LineCol.offset = auVar10._0_8_;
        LVar13.super_LineCol.line = auVar10._8_8_;
        LVar13.super_LineCol.col = auVar10._16_8_;
        LVar13.name.str._4_4_ = 0;
        LVar13.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_e8,0x3b,LVar13,(this->m_stack).m_callbacks.m_user_data);
      }
      n = _append_key_val(this,(csubstr)ZEXT816(0),0);
    }
  }
LAB_001cfcbc:
  if (n == (NodeData *)0x0) goto LAB_001cfef5;
  node = Tree::id(this->m_tree,n);
  pTVar5 = this->m_tree;
  uVar6 = this->m_state->node_id;
  if ((uVar6 == 0xffffffffffffffff) || (pTVar5->m_cap <= uVar6)) {
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar7 = (code *)swi(3);
      (*pcVar7)();
      return;
    }
    local_e8[0] = '\0';
    local_e8[1] = '\0';
    local_e8[2] = '\0';
    local_e8[3] = '\0';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    local_e8[8] = -0x7a;
    local_e8[9] = 'K';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    pcStack_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_c8._0_1_ = 'e';
    local_c8._1_1_ = '\0';
    local_c8._2_1_ = '\0';
    local_c8._3_1_ = '\0';
    local_c8._4_1_ = '\0';
    local_c8._5_1_ = '\0';
    local_c8._6_1_ = '\0';
    local_c8._7_1_ = '\0';
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((pTVar5->m_buf[uVar6].m_type.type & SEQ) == NOTYPE) {
    pTVar5 = this->m_tree;
    uVar6 = this->m_state->node_id;
    if ((uVar6 == 0xffffffffffffffff) || (pTVar5->m_cap <= uVar6)) {
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar7 = (code *)swi(3);
        (*pcVar7)();
        return;
      }
      local_e8[0] = '\0';
      local_e8[1] = '\0';
      local_e8[2] = '\0';
      local_e8[3] = '\0';
      local_e8[4] = '\0';
      local_e8[5] = '\0';
      local_e8[6] = '\0';
      local_e8[7] = '\0';
      local_e8[8] = -0x7a;
      local_e8[9] = 'K';
      local_e8[10] = '\0';
      local_e8[0xb] = '\0';
      local_e8[0xc] = '\0';
      local_e8[0xd] = '\0';
      local_e8[0xe] = '\0';
      local_e8[0xf] = '\0';
      local_e8[0x10] = '\0';
      local_e8[0x11] = '\0';
      local_e8[0x12] = '\0';
      local_e8[0x13] = '\0';
      local_e8[0x14] = '\0';
      local_e8[0x15] = '\0';
      local_e8[0x16] = '\0';
      local_e8[0x17] = '\0';
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8._0_1_ = 'e';
      local_c8._1_1_ = '\0';
      local_c8._2_1_ = '\0';
      local_c8._3_1_ = '\0';
      local_c8._4_1_ = '\0';
      local_c8._5_1_ = '\0';
      local_c8._6_1_ = '\0';
      local_c8._7_1_ = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar5->m_buf[uVar6].m_type.type & DOC) != NOTYPE) goto LAB_001cfe16;
  }
  else {
LAB_001cfe16:
    if (((this->m_key_anchor).len != 0) && ((this->m_key_anchor).str != (char *)0x0)) {
      sVar8 = (this->m_key_anchor).len;
      (this->m_val_anchor).str = (this->m_key_anchor).str;
      (this->m_val_anchor).len = sVar8;
      (this->m_key_anchor).str = (char *)0x0;
      (this->m_key_anchor).len = 0;
    }
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar8 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar8;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
    }
  }
  pcVar3 = (this->m_val_anchor).str;
  if (pcVar3 != (char *)0x0 && (this->m_val_anchor).len != 0) {
    anchor.len = (this->m_val_anchor).len;
    anchor.str = pcVar3;
    Tree::set_val_anchor(this->m_tree,node,anchor);
    (this->m_val_anchor).str = (char *)0x0;
    (this->m_val_anchor).len = 0;
  }
  pcVar3 = (this->m_val_tag).str;
  if (pcVar3 != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar5 = this->m_tree;
    tag.len = (this->m_val_tag).len;
    tag.str = pcVar3;
    cVar16 = normalize_tag(tag);
    Tree::set_val_tag(pTVar5,node,cVar16);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
LAB_001cfef5:
  if (1 < (this->m_stack).m_size) {
    do {
      if (((this->m_stack).m_stack[(this->m_stack).m_size - 1].flags & 0x200) != 0) {
        local_c8._0_1_ = 'm';
        local_c8._1_1_ = '_';
        local_c8._2_1_ = 's';
        local_c8._3_1_ = 't';
        local_c8._4_1_ = 'a';
        local_c8._5_1_ = 'c';
        local_c8._6_1_ = 'k';
        local_c8._7_1_ = '.';
        uStack_c0 = 0x706f74;
        uStack_bd = 0x29292928;
        builtin_strncpy(local_e8 + 0x10," has_any",8);
        pcStack_d0 = (char *)0x26202c4c43535328;
        builtin_strncpy(local_e8,"check failed: (!",0x10);
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar7 = (code *)swi(3);
          (*pcVar7)();
          return;
        }
        local_78 = 0;
        uStack_70 = 0x77f1;
        local_68 = 0;
        pcStack_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_58 = 0x65;
        auVar10 = ZEXT1224(ZEXT412(0x77f1) << 0x40);
        LVar12.name.str._0_4_ = 0x1fdf9a;
        LVar12.super_LineCol.offset = auVar10._0_8_;
        LVar12.super_LineCol.line = auVar10._8_8_;
        LVar12.super_LineCol.col = auVar10._16_8_;
        LVar12.name.str._4_4_ = 0;
        LVar12.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_e8,0x30,LVar12,(this->m_stack).m_callbacks.m_user_data);
      }
      if ((~this->m_state->flags & 0x18U) == 0) {
        fmt.len = 0x13;
        fmt.str = "closing ] not found";
        _err<>(this,fmt);
      }
      _pop_level(this);
    } while (1 < (this->m_stack).m_size);
  }
  this->m_state->flags = this->m_state->flags | 0x1000;
  return;
}

Assistant:

void Parser::_end_stream()
{
    _c4dbgpf("end_stream, level={} node_id={}", m_state->level, m_state->node_id);
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! m_stack.empty());
    NodeData *added = nullptr;
    if(has_any(SSCL))
    {
        if(m_tree->is_seq(m_state->node_id))
        {
            _c4dbgp("append val...");
            added = _append_val(_consume_scalar());
        }
        else if(m_tree->is_map(m_state->node_id))
        {
            _c4dbgp("append null key val...");
            added = _append_key_val_null(m_state->line_contents.rem.str);
            #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
            if(has_any(RSEQIMAP))
            {
                _stop_seqimap();
                _pop_level();
            }
            #endif
        }
        else if(m_tree->is_doc(m_state->node_id) || m_tree->type(m_state->node_id) == NOTYPE)
        {
            NodeType_e quoted = has_any(QSCL) ? VALQUO : NOTYPE; // do this before consuming the scalar
            csubstr scalar = _consume_scalar();
            _c4dbgpf("node[{}]: to docval '{}'{}", m_state->node_id, scalar, quoted == VALQUO ? ", quoted" : "");
            m_tree->to_val(m_state->node_id, scalar, DOC|quoted);
            added = m_tree->get(m_state->node_id);
        }
        else
        {
            _c4err("internal error");
        }
    }
    else if(has_all(RSEQ|RVAL) && has_none(FLOW))
    {
        _c4dbgp("add last...");
        added = _append_val_null(m_state->line_contents.rem.str);
    }
    else if(!m_val_tag.empty() && (m_tree->is_doc(m_state->node_id) || m_tree->type(m_state->node_id) == NOTYPE))
    {
        csubstr scalar = m_state->line_contents.rem.first(0);
        _c4dbgpf("node[{}]: add null scalar as docval", m_state->node_id);
        m_tree->to_val(m_state->node_id, scalar, DOC);
        added = m_tree->get(m_state->node_id);
    }

    if(added)
    {
        size_t added_id = m_tree->id(added);
        if(m_tree->is_seq(m_state->node_id) || m_tree->is_doc(m_state->node_id))
        {
            if(!m_key_anchor.empty())
            {
                _c4dbgpf("node[{}]: move key to val anchor: '{}'", added_id, m_key_anchor);
                m_val_anchor = m_key_anchor;
                m_key_anchor = {};
            }
            if(!m_key_tag.empty())
            {
                _c4dbgpf("node[{}]: move key to val tag: '{}'", added_id, m_key_tag);
                m_val_tag = m_key_tag;
                m_key_tag = {};
            }
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(!m_key_anchor.empty())
        {
            _c4dbgpf("node[{}]: set key anchor='{}'", added_id, m_key_anchor);
            m_tree->set_key_anchor(added_id, m_key_anchor);
            m_key_anchor = {};
        }
        #endif
        if(!m_val_anchor.empty())
        {
            _c4dbgpf("node[{}]: set val anchor='{}'", added_id, m_val_anchor);
            m_tree->set_val_anchor(added_id, m_val_anchor);
            m_val_anchor = {};
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(!m_key_tag.empty())
        {
            _c4dbgpf("node[{}]: set key tag='{}' -> '{}'", added_id, m_key_tag, normalize_tag(m_key_tag));
            m_tree->set_key_tag(added_id, normalize_tag(m_key_tag));
            m_key_tag = {};
        }
        #endif
        if(!m_val_tag.empty())
        {
            _c4dbgpf("node[{}]: set val tag='{}' -> '{}'", added_id, m_val_tag, normalize_tag(m_val_tag));
            m_tree->set_val_tag(added_id, normalize_tag(m_val_tag));
            m_val_tag = {};
        }
    }

    while(m_stack.size() > 1)
    {
        _c4dbgpf("popping level: {} (stack sz={})", m_state->level, m_stack.size());
        _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_any(SSCL, &m_stack.top()));
        if(has_all(RSEQ|FLOW))
            _err("closing ] not found");
        _pop_level();
    }
    add_flags(NDOC);
}